

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToBool(char *str,bool *value)

{
  int iVar1;
  bool bVar2;
  int ival;
  
  iVar1 = __isoc99_sscanf(str,"%d");
  if (iVar1 == 1) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((str != "true") && (iVar1 = strncmp(str,"true",0x7fffffff), iVar1 != 0)) {
      if (str == "false") {
        bVar2 = false;
      }
      else {
        iVar1 = strncmp(str,"false",0x7fffffff);
        bVar2 = false;
        if (iVar1 != 0) {
          return false;
        }
      }
    }
  }
  *value = bVar2;
  return true;
}

Assistant:

bool XMLUtil::ToBool(const char* str, bool* value)
{
    int ival = 0;
    if (ToInt(str, &ival)) {
        *value = (ival == 0) ? false : true;
        return true;
    }
    if (StringEqual(str, "true")) {
        *value = true;
        return true;
    } else if (StringEqual(str, "false")) {
        *value = false;
        return true;
    }
    return false;
}